

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher_aes_cbc_hmac_sha256_hw.c
# Opt level: O0

void aesni_cbc_hmac_sha256_set_mac_key(void *vctx,uchar *mackey,size_t len)

{
  ulong in_RDX;
  void *in_RSI;
  long in_RDI;
  uchar hmac_key [64];
  uint i;
  PROV_AES_HMAC_SHA256_CTX *ctx;
  byte abStackY_68 [8];
  size_t in_stack_ffffffffffffffa0;
  void *in_stack_ffffffffffffffa8;
  SHA256_CTX *in_stack_ffffffffffffffb0;
  uint local_24;
  
  memset(abStackY_68,0,0x40);
  if (in_RDX < 0x41) {
    memcpy(abStackY_68,in_RSI,in_RDX);
  }
  else {
    SHA256_Init((SHA256_CTX *)(in_RDI + 0x1f8));
    sha256_update(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    SHA256_Final(abStackY_68,(SHA256_CTX *)(in_RDI + 0x1f8));
  }
  for (local_24 = 0; local_24 < 0x40; local_24 = local_24 + 1) {
    abStackY_68[local_24] = abStackY_68[local_24] ^ 0x36;
  }
  SHA256_Init((SHA256_CTX *)(in_RDI + 0x1f8));
  sha256_update(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  for (local_24 = 0; local_24 < 0x40; local_24 = local_24 + 1) {
    abStackY_68[local_24] = abStackY_68[local_24] ^ 0x6a;
  }
  SHA256_Init((SHA256_CTX *)(in_RDI + 0x268));
  sha256_update(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  OPENSSL_cleanse(abStackY_68,0x40);
  return;
}

Assistant:

static void aesni_cbc_hmac_sha256_set_mac_key(void *vctx,
                                              const unsigned char *mackey,
                                              size_t len)
{
    PROV_AES_HMAC_SHA256_CTX *ctx = (PROV_AES_HMAC_SHA256_CTX *)vctx;
    unsigned int i;
    unsigned char hmac_key[64];

    memset(hmac_key, 0, sizeof(hmac_key));

    if (len > sizeof(hmac_key)) {
        SHA256_Init(&ctx->head);
        sha256_update(&ctx->head, mackey, len);
        SHA256_Final(hmac_key, &ctx->head);
    } else {
        memcpy(hmac_key, mackey, len);
    }

    for (i = 0; i < sizeof(hmac_key); i++)
        hmac_key[i] ^= 0x36; /* ipad */
    SHA256_Init(&ctx->head);
    sha256_update(&ctx->head, hmac_key, sizeof(hmac_key));

    for (i = 0; i < sizeof(hmac_key); i++)
        hmac_key[i] ^= 0x36 ^ 0x5c; /* opad */
    SHA256_Init(&ctx->tail);
    sha256_update(&ctx->tail, hmac_key, sizeof(hmac_key));

    OPENSSL_cleanse(hmac_key, sizeof(hmac_key));
}